

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2protocol.cpp
# Opt level: O0

void Http2::appendProtocolUpgradeHeaders(QHttp2Configuration *config,QHttpNetworkRequest *request)

{
  bool bVar1;
  long *in_RSI;
  long in_FS_OFFSET;
  Frame frame;
  QByteArray value;
  QByteArrayView separator;
  QByteArray connectionHeader;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_const_QByteArrayView_&>,_const_char_(&)[24]>
  *in_stack_fffffffffffffe38;
  QByteArray *in_stack_fffffffffffffe40;
  char (*in_stack_fffffffffffffe48) [11];
  long *plVar2;
  QByteArrayView *in_stack_fffffffffffffe50;
  QByteArray *this;
  Frame *frame_00;
  undefined1 local_138 [24];
  QByteArray local_120;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  Frame local_e8;
  QByteArray local_d0;
  QByteArray local_b8;
  QStringBuilder<const_QByteArray_&,_const_QByteArrayView_&> local_a0;
  QStringBuilder<const_QByteArray_&,_const_QByteArrayView_&> local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  QByteArrayView local_58;
  undefined1 local_48 [24];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QByteArrayView::QByteArrayView<11ul>(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  QByteArray::QByteArray((QByteArray *)0x2a01d7);
  (**(code **)(*in_RSI + 0x48))(&local_20,in_RSI,local_30,local_28,local_48);
  QByteArray::~QByteArray((QByteArray *)0x2a020f);
  local_58.m_size = -0x5555555555555556;
  local_58.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
  bVar1 = QByteArray::isEmpty((QByteArray *)0x2a023a);
  if (bVar1) {
    QByteArrayView::QByteArrayView(&local_58);
  }
  else {
    QByteArrayView::QByteArrayView<3ul>
              (in_stack_fffffffffffffe50,(char (*) [3])in_stack_fffffffffffffe48);
  }
  local_78 = 0xaaaaaaaaaaaaaaaa;
  uStack_70 = 0xaaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  local_a0 = ::operator+(in_stack_fffffffffffffe40,(QByteArrayView *)in_stack_fffffffffffffe38);
  ::operator+(&local_90,(char (*) [24])in_stack_fffffffffffffe38);
  ::QStringBuilder::operator_cast_to_QByteArray(in_stack_fffffffffffffe38);
  this = &local_b8;
  plVar2 = in_RSI;
  QByteArray::QByteArray(this,"Connection",-1);
  (**(code **)(*plVar2 + 0x50))(plVar2,this,&local_78);
  QByteArray::~QByteArray((QByteArray *)0x2a033f);
  QByteArray::QByteArray(&local_d0,"Upgrade",-1);
  frame_00 = &local_e8;
  QByteArray::QByteArray((QByteArray *)frame_00,"h2c",-1);
  (**(code **)(*in_RSI + 0x50))(in_RSI,&local_d0,frame_00);
  QByteArray::~QByteArray((QByteArray *)0x2a03aa);
  QByteArray::~QByteArray((QByteArray *)0x2a03b4);
  local_f8 = 0xaaaaaaaaaaaaaaaa;
  local_108 = 0xaaaaaaaaaaaaaaaa;
  uStack_100 = 0xaaaaaaaaaaaaaaaa;
  configurationToSettingsFrame((QHttp2Configuration *)this);
  QByteArray::QByteArray(&local_120,"HTTP2-Settings",-1);
  settingsFrameToBase64(frame_00);
  (**(code **)(*in_RSI + 0x50))(in_RSI,&local_120,local_138);
  QByteArray::~QByteArray((QByteArray *)0x2a044e);
  QByteArray::~QByteArray((QByteArray *)0x2a0458);
  Frame::~Frame((Frame *)0x2a0462);
  QByteArray::~QByteArray((QByteArray *)0x2a046c);
  QByteArray::~QByteArray((QByteArray *)0x2a0476);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendProtocolUpgradeHeaders(const QHttp2Configuration &config, QHttpNetworkRequest *request)
{
    Q_ASSERT(request);
    // RFC 2616, 14.10
    // RFC 7540, 3.2
    const QByteArray connectionHeader = request->headerField("Connection");
    const auto separator = connectionHeader.isEmpty() ? QByteArrayView() : QByteArrayView(", ");
    // We _append_ 'Upgrade':
    QByteArray value = connectionHeader + separator + "Upgrade, HTTP2-Settings";
    request->setHeaderField("Connection", value);
    // This we just (re)write.
    request->setHeaderField("Upgrade", "h2c");

    const Frame frame(configurationToSettingsFrame(config));
    // This we just (re)write.
    request->setHeaderField("HTTP2-Settings", settingsFrameToBase64(frame));
}